

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

ssize_t __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
          (intrusive_list<(anonymous_namespace)::TestObject> *this,int __fdin,__off64_t *__offin,
          int __fdout,__off64_t *__offout,size_t __len,uint __flags)

{
  long lVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  TestObject *in_RAX;
  TestObject *extraout_RAX;
  undefined4 in_register_0000000c;
  TestObject *pTVar4;
  TestObject *pTVar5;
  pointer *__ptr;
  undefined4 in_register_00000034;
  iterator pos;
  iterator iVar6;
  undefined4 in_stack_0000000c;
  TestObject *in_stack_00000010;
  _Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false> local_38;
  
  pos.list_._4_4_ = in_register_00000034;
  pos.list_._0_4_ = __fdin;
  pTVar4 = (TestObject *)CONCAT44(in_register_0000000c,__fdout);
  local_38._M_head_impl = in_RAX;
  if (__offout != (__off64_t *)CONCAT44(in_stack_0000000c,__flags)) {
LAB_00153dcf:
    __assert_fail("list_ == rhs.list_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                  ,0xbf,
                  "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator!=(iterator) const [T = (anonymous namespace)::TestObject]"
                 );
  }
  if ((TestObject *)__len != in_stack_00000010) {
    do {
      if ((TestObject *)__len == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                      ,0xa3,
                      "iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator++() [T = (anonymous namespace)::TestObject]"
                     );
      }
      lVar1 = *(long *)&pTVar4->data;
      if (lVar1 == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                      ,0x221,
                      "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
                     );
      }
      if ((TestObject *)__offout != pTVar4) goto LAB_00153dcf;
      pTVar2 = (((TestObject *)__len)->super_intrusive_list_base<(anonymous_namespace)::TestObject>)
               .next_;
      if ((pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
          (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_) {
        (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
             (TestObject *)0x0;
        (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
             (TestObject *)0x0;
      }
      else {
        pTVar3 = (((TestObject *)__len)->
                 super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
        pTVar5 = pTVar3;
        if (pTVar3 == (TestObject *)0x0) {
          pTVar5 = pTVar4;
        }
        (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
        if (pTVar2 == (TestObject *)0x0) {
          (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
        }
        else {
          (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
        }
      }
      (((TestObject *)__len)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
           (TestObject *)0x0;
      (((TestObject *)__len)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
           (TestObject *)0x0;
      *(long *)&pTVar4->data = lVar1 + -1;
      pos.node_ = (TestObject *)__offin;
      local_38._M_head_impl = (TestObject *)__len;
      iVar6 = insert(this,pos,(unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                               *)&local_38);
      in_RAX = (TestObject *)iVar6.list_;
      if (local_38._M_head_impl != (TestObject *)0x0) {
        if ((local_38._M_head_impl)->moved == false) {
          ::(anonymous_namespace)::TestObject::creation_count =
               ::(anonymous_namespace)::TestObject::creation_count + -1;
        }
        operator_delete(local_38._M_head_impl,0x20);
        in_RAX = extraout_RAX;
      }
      local_38._M_head_impl = (TestObject *)0x0;
      __len = (size_t)pTVar2;
    } while (pTVar2 != in_stack_00000010);
  }
  return (ssize_t)in_RAX;
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}